

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O3

int anon_unknown.dwarf_747b::RtMidi_callbackwrapper(lua_State *L)

{
  lua_pushvalue(L,0xffffd8ed);
  lua_pushvalue(L,1);
  lua_pushvalue(L,2);
  lua_pushvalue(L,0xffffd8ec);
  lua_call(L,3,0);
  return 0;
}

Assistant:

int RtMidi_callbackwrapper(lua_State *L) {
	lua_pushvalue(L, lua_upvalueindex(1)); // error callback
	lua_pushvalue(L, 1);
	lua_pushvalue(L, 2);
	lua_pushvalue(L, lua_upvalueindex(2)); // user data
	lua_call(L, 3, 0);
	return 0;
}